

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O1

void av1_reset_cdf_symbol_counters(FRAME_CONTEXT *fc)

{
  undefined1 auVar1 [16];
  int i;
  long lVar2;
  ulong uVar3;
  aom_cdf_prob *paVar4;
  aom_cdf_prob *paVar5;
  FRAME_CONTEXT *pFVar6;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar48;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  long lVar96;
  
  auVar1 = _DAT_004ca150;
  lVar2 = 0x16;
  auVar13 = _DAT_004ca130;
  auVar38 = _DAT_004ca140;
  do {
    if (SUB164(auVar38 ^ auVar1,4) == -0x80000000 && SUB164(auVar38 ^ auVar1,0) < -0x7fffffbf) {
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x3c + lVar2) = 0;
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x42 + lVar2) = 0;
    }
    if (SUB164(auVar13 ^ auVar1,4) == -0x80000000 && SUB164(auVar13 ^ auVar1,0) < -0x7fffffbf) {
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x48 + lVar2) = 0;
      *(undefined2 *)((long)fc->txb_skip_cdf[0][0] + lVar2) = 0;
    }
    lVar7 = auVar38._8_8_;
    auVar38._0_8_ = auVar38._0_8_ + 4;
    auVar38._8_8_ = lVar7 + 4;
    lVar7 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 4;
    auVar13._8_8_ = lVar7 + 4;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x1ae);
  lVar2 = 0x19c;
  auVar12 = _DAT_004ca130;
  auVar49 = _DAT_004ca140;
  do {
    if (SUB164(auVar49 ^ auVar1,4) == -0x80000000 && SUB164(auVar49 ^ auVar1,0) < -0x7fffffa6) {
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x3c + lVar2) = 0;
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x42 + lVar2) = 0;
    }
    if (SUB164(auVar12 ^ auVar1,4) == -0x80000000 && SUB164(auVar12 ^ auVar1,0) < -0x7fffffa6) {
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x48 + lVar2) = 0;
      *(undefined2 *)((long)fc->txb_skip_cdf[0][0] + lVar2) = 0;
    }
    lVar7 = auVar49._8_8_;
    auVar49._0_8_ = auVar49._0_8_ + 4;
    auVar49._8_8_ = lVar7 + 4;
    lVar7 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 4;
    auVar12._8_8_ = lVar7 + 4;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x3c4);
  lVar2 = 0;
  auVar54 = _DAT_004ca140;
  do {
    if (SUB164(auVar54 ^ auVar1,4) == -0x80000000 && SUB164(auVar54 ^ auVar1,0) < -0x7ffffffa) {
      *(undefined2 *)((long)fc->dc_sign_cdf[0][0] + lVar2 + 4) = 0;
      *(undefined2 *)((long)fc->dc_sign_cdf[0][1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar54._8_8_;
    auVar54._0_8_ = auVar54._0_8_ + 2;
    auVar54._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x24);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->eob_flag_cdf16[0][0] + lVar2 + 10) = 0;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x30);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->eob_flag_cdf32[0][0] + lVar2 + 0xc) = 0;
    lVar2 = lVar2 + 0xe;
  } while (lVar2 != 0x38);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->eob_flag_cdf64[0][0] + lVar2 + 0xe) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->eob_flag_cdf128[0][0] + lVar2 + 0x10) = 0;
    lVar2 = lVar2 + 0x12;
  } while (lVar2 != 0x48);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->eob_flag_cdf256[0][0] + lVar2 + 0x12) = 0;
    lVar2 = lVar2 + 0x14;
  } while (lVar2 != 0x50);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->eob_flag_cdf512[0][0] + lVar2 + 0x14) = 0;
    lVar2 = lVar2 + 0x16;
  } while (lVar2 != 0x58);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->eob_flag_cdf1024[0][0] + lVar2 + 0x16) = 0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x60);
  lVar2 = 0;
  do {
    fc->coeff_base_eob_cdf[0][0][lVar2][3] = 0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x28);
  lVar2 = 0x74c;
  auVar56 = _DAT_004cbd20;
  auVar60 = _DAT_004cbd30;
  auVar66 = _DAT_004ca130;
  auVar86 = _DAT_004ca140;
  do {
    auVar13 = auVar86 ^ auVar1;
    auVar146._0_4_ = -(uint)(auVar13._0_4_ < -0x7ffffe5c);
    auVar146._4_4_ = -(uint)(auVar13._0_4_ < -0x7ffffe5c);
    auVar146._8_4_ = -(uint)(auVar13._8_4_ < -0x7ffffe5c);
    auVar146._12_4_ = -(uint)(auVar13._8_4_ < -0x7ffffe5c);
    auVar114._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar114._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar114._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar114._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar114 = auVar114 & auVar146;
    auVar13 = pshuflw(auVar13,auVar114,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 8 + lVar2) = 0;
    }
    auVar13 = packssdw(auVar114,auVar114);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x12 + lVar2) = 0;
    }
    auVar13 = auVar66 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar115._4_4_ = iVar11;
    auVar115._0_4_ = iVar11;
    auVar115._8_4_ = iVar48;
    auVar115._12_4_ = iVar48;
    auVar147._0_4_ = -(uint)(iVar11 < -0x7ffffe5c);
    auVar147._4_4_ = -(uint)(iVar11 < -0x7ffffe5c);
    auVar147._8_4_ = -(uint)(iVar48 < -0x7ffffe5c);
    auVar147._12_4_ = -(uint)(iVar48 < -0x7ffffe5c);
    auVar14._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar14._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar14._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar14._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar14 = auVar14 & auVar147;
    auVar13 = packssdw(auVar115,auVar14);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x1c + lVar2) = 0;
    }
    auVar13 = pshufhw(auVar14,auVar14,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x26 + lVar2) = 0;
    }
    auVar13 = auVar60 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar116._4_4_ = iVar11;
    auVar116._0_4_ = iVar11;
    auVar116._8_4_ = iVar48;
    auVar116._12_4_ = iVar48;
    auVar148._0_4_ = -(uint)(iVar11 < -0x7ffffe5c);
    auVar148._4_4_ = -(uint)(iVar11 < -0x7ffffe5c);
    auVar148._8_4_ = -(uint)(iVar48 < -0x7ffffe5c);
    auVar148._12_4_ = -(uint)(iVar48 < -0x7ffffe5c);
    auVar15._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar15._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar15._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar15._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar15 = auVar15 & auVar148;
    auVar13 = pshuflw(auVar116,auVar15,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x30 + lVar2) = 0;
    }
    auVar13 = packssdw(auVar15,auVar15);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x3a + lVar2) = 0;
    }
    auVar13 = auVar56 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar117._4_4_ = iVar11;
    auVar117._0_4_ = iVar11;
    auVar117._8_4_ = iVar48;
    auVar117._12_4_ = iVar48;
    auVar149._0_4_ = -(uint)(iVar11 < -0x7ffffe5c);
    auVar149._4_4_ = -(uint)(iVar11 < -0x7ffffe5c);
    auVar149._8_4_ = -(uint)(iVar48 < -0x7ffffe5c);
    auVar149._12_4_ = -(uint)(iVar48 < -0x7ffffe5c);
    auVar16._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar16._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar16._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar16._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar16 = auVar16 & auVar149;
    auVar13 = packssdw(auVar117,auVar16);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)(fc->txb_skip_cdf + -1) + 0x44 + lVar2) = 0;
    }
    auVar13 = pshufhw(auVar16,auVar16,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->txb_skip_cdf[0][0] + lVar2) = 0;
    }
    lVar7 = auVar86._8_8_;
    auVar86._0_8_ = auVar86._0_8_ + 8;
    auVar86._8_8_ = lVar7 + 8;
    lVar7 = auVar66._8_8_;
    auVar66._0_8_ = auVar66._0_8_ + 8;
    auVar66._8_8_ = lVar7 + 8;
    lVar7 = auVar60._8_8_;
    auVar60._0_8_ = auVar60._0_8_ + 8;
    auVar60._8_8_ = lVar7 + 8;
    lVar7 = auVar56._8_8_;
    auVar56._0_8_ = auVar56._0_8_ + 8;
    auVar56._8_8_ = lVar7 + 8;
    lVar2 = lVar2 + 0x50;
  } while (lVar2 != 0x17dc);
  lVar2 = 0;
  auVar57 = _DAT_004cbd20;
  auVar61 = _DAT_004cbd30;
  auVar67 = _DAT_004ca130;
  auVar87 = _DAT_004ca140;
  do {
    auVar13 = auVar87 ^ auVar1;
    auVar175._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffff2e);
    auVar175._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffff2e);
    auVar175._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffff2e);
    auVar175._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffff2e);
    auVar150._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar150._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar150._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar150._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar150 = auVar150 & auVar175;
    auVar13 = pshuflw(auVar13,auVar150,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->coeff_br_cdf[0][0][0] + lVar2 + 8) = 0;
    }
    auVar13 = packssdw(auVar150,auVar150);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)fc->coeff_br_cdf[0][0][1] + lVar2 + 8) = 0;
    }
    auVar13 = auVar67 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar151._4_4_ = iVar11;
    auVar151._0_4_ = iVar11;
    auVar151._8_4_ = iVar48;
    auVar151._12_4_ = iVar48;
    auVar176._0_4_ = -(uint)(iVar11 < -0x7fffff2e);
    auVar176._4_4_ = -(uint)(iVar11 < -0x7fffff2e);
    auVar176._8_4_ = -(uint)(iVar48 < -0x7fffff2e);
    auVar176._12_4_ = -(uint)(iVar48 < -0x7fffff2e);
    auVar17._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar17._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar17._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar17._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar17 = auVar17 & auVar176;
    auVar13 = packssdw(auVar151,auVar17);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->coeff_br_cdf[0][0][2] + lVar2 + 8) = 0;
    }
    auVar13 = pshufhw(auVar17,auVar17,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->coeff_br_cdf[0][0][3] + lVar2 + 8) = 0;
    }
    auVar13 = auVar61 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar152._4_4_ = iVar11;
    auVar152._0_4_ = iVar11;
    auVar152._8_4_ = iVar48;
    auVar152._12_4_ = iVar48;
    auVar177._0_4_ = -(uint)(iVar11 < -0x7fffff2e);
    auVar177._4_4_ = -(uint)(iVar11 < -0x7fffff2e);
    auVar177._8_4_ = -(uint)(iVar48 < -0x7fffff2e);
    auVar177._12_4_ = -(uint)(iVar48 < -0x7fffff2e);
    auVar18._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar18._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar18._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar18._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar18 = auVar18 & auVar177;
    auVar13 = pshuflw(auVar152,auVar18,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->coeff_br_cdf[0][0][4] + lVar2 + 8) = 0;
    }
    auVar13 = packssdw(auVar18,auVar18);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->coeff_br_cdf[0][0][5] + lVar2 + 8) = 0;
    }
    auVar13 = auVar57 ^ auVar1;
    auVar19._4_4_ = auVar13._4_4_;
    auVar19._12_4_ = auVar13._12_4_;
    auVar178._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffff2e);
    auVar178._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffff2e);
    auVar178._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffff2e);
    auVar178._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffff2e);
    auVar19._0_4_ = auVar19._4_4_;
    auVar19._8_4_ = auVar19._12_4_;
    auVar118._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar118._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar118._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar118._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar13 = packssdw(auVar19,auVar118 & auVar178);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->coeff_br_cdf[0][0][6] + lVar2 + 8) = 0;
    }
    auVar13 = pshufhw(auVar13,auVar118 & auVar178,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->coeff_br_cdf[0][0][7] + lVar2 + 8) = 0;
    }
    lVar7 = auVar87._8_8_;
    auVar87._0_8_ = auVar87._0_8_ + 8;
    auVar87._8_8_ = lVar7 + 8;
    lVar7 = auVar67._8_8_;
    auVar67._0_8_ = auVar67._0_8_ + 8;
    auVar67._8_8_ = lVar7 + 8;
    lVar7 = auVar61._8_8_;
    auVar61._0_8_ = auVar61._0_8_ + 8;
    auVar61._8_8_ = lVar7 + 8;
    lVar7 = auVar57._8_8_;
    auVar57._0_8_ = auVar57._0_8_ + 8;
    auVar57._8_8_ = lVar7 + 8;
    lVar2 = lVar2 + 0x50;
  } while (lVar2 != 0x870);
  lVar2 = 0;
  auVar58 = _DAT_004ca140;
  do {
    if (SUB164(auVar58 ^ auVar1,4) == -0x80000000 && SUB164(auVar58 ^ auVar1,0) < -0x7ffffffa) {
      *(undefined2 *)((long)fc->newmv_cdf[0] + lVar2 + 4) = 0;
      *(undefined2 *)((long)fc->newmv_cdf[1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar58._8_8_;
    auVar58._0_8_ = auVar58._0_8_ + 2;
    auVar58._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x24);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->zeromv_cdf[0] + lVar2 + 4) = 0;
    lVar2 = lVar2 + 6;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  auVar59 = _DAT_004ca140;
  do {
    if (SUB164(auVar59 ^ auVar1,4) == -0x80000000 && SUB164(auVar59 ^ auVar1,0) < -0x7ffffffa) {
      *(undefined2 *)((long)fc->refmv_cdf[0] + lVar2 + 4) = 0;
      *(undefined2 *)((long)fc->refmv_cdf[1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar59._8_8_;
    auVar59._0_8_ = auVar59._0_8_ + 2;
    auVar59._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x24);
  lVar2 = 0;
  fc->drl_cdf[0][2] = 0;
  fc->drl_cdf[1][2] = 0;
  fc->drl_cdf[2][2] = 0;
  do {
    *(undefined2 *)((long)fc->inter_compound_mode_cdf[0] + lVar2 + 0x10) = 0;
    lVar2 = lVar2 + 0x12;
  } while (lVar2 != 0x90);
  lVar2 = 0;
  auVar68 = _DAT_004cbd20;
  auVar88 = _DAT_004cbd30;
  auVar97 = _DAT_004ca130;
  auVar105 = _DAT_004ca140;
  do {
    auVar13 = auVar105 ^ auVar1;
    auVar153._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar153._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar153._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar153._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar119._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar119._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar119._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar119._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar119 = auVar119 & auVar153;
    auVar13 = pshuflw(auVar13,auVar119,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->compound_type_cdf[0] + lVar2 + 4) = 0;
    }
    auVar13 = packssdw(auVar119,auVar119);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)fc->compound_type_cdf[1] + lVar2 + 4) = 0;
    }
    auVar13 = auVar97 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar120._4_4_ = iVar11;
    auVar120._0_4_ = iVar11;
    auVar120._8_4_ = iVar48;
    auVar120._12_4_ = iVar48;
    auVar154._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar154._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar154._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar154._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar20._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar154;
    auVar13 = packssdw(auVar120,auVar20);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->compound_type_cdf[2] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar20,auVar20,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->compound_type_cdf[3] + lVar2 + 4) = 0;
    }
    auVar13 = auVar88 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar121._4_4_ = iVar11;
    auVar121._0_4_ = iVar11;
    auVar121._8_4_ = iVar48;
    auVar121._12_4_ = iVar48;
    auVar155._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar155._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar155._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar155._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar21._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar155;
    auVar13 = pshuflw(auVar121,auVar21,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->compound_type_cdf[4] + lVar2 + 4) = 0;
    }
    auVar13 = packssdw(auVar21,auVar21);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->compound_type_cdf[5] + lVar2 + 4) = 0;
    }
    auVar13 = auVar68 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar122._4_4_ = iVar11;
    auVar122._0_4_ = iVar11;
    auVar122._8_4_ = iVar48;
    auVar122._12_4_ = iVar48;
    auVar156._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar156._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar156._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar156._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar22._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar156;
    auVar13 = packssdw(auVar122,auVar22);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->compound_type_cdf[6] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar22,auVar22,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->compound_type_cdf[7] + lVar2 + 4) = 0;
    }
    lVar7 = auVar105._8_8_;
    auVar105._0_8_ = auVar105._0_8_ + 8;
    auVar105._8_8_ = lVar7 + 8;
    lVar7 = auVar97._8_8_;
    auVar97._0_8_ = auVar97._0_8_ + 8;
    auVar97._8_8_ = lVar7 + 8;
    lVar7 = auVar88._8_8_;
    auVar88._0_8_ = auVar88._0_8_ + 8;
    auVar88._8_8_ = lVar7 + 8;
    lVar7 = auVar68._8_8_;
    auVar68._0_8_ = auVar68._0_8_ + 8;
    auVar68._8_8_ = lVar7 + 8;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x90);
  lVar2 = 0;
  auVar69 = _DAT_004cbd20;
  auVar89 = _DAT_004cbd30;
  auVar98 = _DAT_004ca130;
  auVar106 = _DAT_004ca140;
  do {
    auVar13 = auVar106 ^ auVar1;
    auVar157._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar157._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar157._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar157._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar123._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar123._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar123._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar123._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar123 = auVar123 & auVar157;
    auVar13 = pshuflw(auVar13,auVar123,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_idx_cdf[0] + lVar2 + 0x20) = 0;
    }
    auVar13 = packssdw(auVar123,auVar123);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)fc->wedge_idx_cdf[1] + lVar2 + 0x20) = 0;
    }
    auVar13 = auVar98 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar124._4_4_ = iVar11;
    auVar124._0_4_ = iVar11;
    auVar124._8_4_ = iVar48;
    auVar124._12_4_ = iVar48;
    auVar158._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar158._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar158._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar158._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar23._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar23._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar23._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar23._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar23 = auVar23 & auVar158;
    auVar13 = packssdw(auVar124,auVar23);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_idx_cdf[2] + lVar2 + 0x20) = 0;
    }
    auVar13 = pshufhw(auVar23,auVar23,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_idx_cdf[3] + lVar2 + 0x20) = 0;
    }
    auVar13 = auVar89 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar125._4_4_ = iVar11;
    auVar125._0_4_ = iVar11;
    auVar125._8_4_ = iVar48;
    auVar125._12_4_ = iVar48;
    auVar159._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar159._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar159._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar159._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar24._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar24._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar24._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar24._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar24 = auVar24 & auVar159;
    auVar13 = pshuflw(auVar125,auVar24,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_idx_cdf[4] + lVar2 + 0x20) = 0;
    }
    auVar13 = packssdw(auVar24,auVar24);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_idx_cdf[5] + lVar2 + 0x20) = 0;
    }
    auVar13 = auVar69 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar126._4_4_ = iVar11;
    auVar126._0_4_ = iVar11;
    auVar126._8_4_ = iVar48;
    auVar126._12_4_ = iVar48;
    auVar160._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar160._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar160._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar160._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar25._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar25._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar25._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar25._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar25 = auVar25 & auVar160;
    auVar13 = packssdw(auVar126,auVar25);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_idx_cdf[6] + lVar2 + 0x20) = 0;
    }
    auVar13 = pshufhw(auVar25,auVar25,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_idx_cdf[7] + lVar2 + 0x20) = 0;
    }
    lVar7 = auVar106._8_8_;
    auVar106._0_8_ = auVar106._0_8_ + 8;
    auVar106._8_8_ = lVar7 + 8;
    lVar7 = auVar98._8_8_;
    auVar98._0_8_ = auVar98._0_8_ + 8;
    auVar98._8_8_ = lVar7 + 8;
    lVar7 = auVar89._8_8_;
    auVar89._0_8_ = auVar89._0_8_ + 8;
    auVar89._8_8_ = lVar7 + 8;
    lVar7 = auVar69._8_8_;
    auVar69._0_8_ = auVar69._0_8_ + 8;
    auVar69._8_8_ = lVar7 + 8;
    lVar2 = lVar2 + 0x110;
  } while (lVar2 != 0x330);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->interintra_cdf[0] + lVar2 + 4) = 0;
    lVar2 = lVar2 + 6;
  } while (lVar2 != 0x18);
  lVar2 = 0;
  auVar70 = _DAT_004cbd20;
  auVar90 = _DAT_004cbd30;
  auVar99 = _DAT_004ca130;
  auVar107 = _DAT_004ca140;
  do {
    auVar13 = auVar107 ^ auVar1;
    auVar161._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar161._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar161._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar161._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar127._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar127._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar127._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar127._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar127 = auVar127 & auVar161;
    auVar13 = pshuflw(auVar13,auVar127,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_interintra_cdf[0] + lVar2 + 4) = 0;
    }
    auVar13 = packssdw(auVar127,auVar127);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)fc->wedge_interintra_cdf[1] + lVar2 + 4) = 0;
    }
    auVar13 = auVar99 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar128._4_4_ = iVar11;
    auVar128._0_4_ = iVar11;
    auVar128._8_4_ = iVar48;
    auVar128._12_4_ = iVar48;
    auVar162._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar162._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar162._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar162._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar26._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar26._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar26._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar26._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar26 = auVar26 & auVar162;
    auVar13 = packssdw(auVar128,auVar26);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_interintra_cdf[2] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar26,auVar26,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_interintra_cdf[3] + lVar2 + 4) = 0;
    }
    auVar13 = auVar90 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar129._4_4_ = iVar11;
    auVar129._0_4_ = iVar11;
    auVar129._8_4_ = iVar48;
    auVar129._12_4_ = iVar48;
    auVar163._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar163._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar163._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar163._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar27._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar27._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar27._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar27._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar27 = auVar27 & auVar163;
    auVar13 = pshuflw(auVar129,auVar27,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_interintra_cdf[4] + lVar2 + 4) = 0;
    }
    auVar13 = packssdw(auVar27,auVar27);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_interintra_cdf[5] + lVar2 + 4) = 0;
    }
    auVar13 = auVar70 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar130._4_4_ = iVar11;
    auVar130._0_4_ = iVar11;
    auVar130._8_4_ = iVar48;
    auVar130._12_4_ = iVar48;
    auVar164._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar164._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar164._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar164._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar28._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar28._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar28._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar28._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar28 = auVar28 & auVar164;
    auVar13 = packssdw(auVar130,auVar28);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_interintra_cdf[6] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar28,auVar28,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->wedge_interintra_cdf[7] + lVar2 + 4) = 0;
    }
    lVar7 = auVar107._8_8_;
    auVar107._0_8_ = auVar107._0_8_ + 8;
    auVar107._8_8_ = lVar7 + 8;
    lVar7 = auVar99._8_8_;
    auVar99._0_8_ = auVar99._0_8_ + 8;
    auVar99._8_8_ = lVar7 + 8;
    lVar7 = auVar90._8_8_;
    auVar90._0_8_ = auVar90._0_8_ + 8;
    auVar90._8_8_ = lVar7 + 8;
    lVar7 = auVar70._8_8_;
    auVar70._0_8_ = auVar70._0_8_ + 8;
    auVar70._8_8_ = lVar7 + 8;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x90);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->interintra_mode_cdf[0] + lVar2 + 8) = 0;
    lVar2 = lVar2 + 10;
  } while (lVar2 != 0x28);
  lVar2 = 0;
  auVar71 = _DAT_004cbd20;
  auVar91 = _DAT_004cbd30;
  auVar100 = _DAT_004ca130;
  auVar108 = _DAT_004ca140;
  do {
    auVar13 = auVar108 ^ auVar1;
    auVar165._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar165._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar165._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar165._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar131._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar131._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar131._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar131._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar131 = auVar131 & auVar165;
    auVar13 = pshuflw(auVar13,auVar131,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      fc->motion_mode_cdf[lVar2][3] = 0;
    }
    auVar13 = packssdw(auVar131,auVar131);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
      fc->motion_mode_cdf[lVar2 + 1][3] = 0;
    }
    auVar13 = auVar100 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar132._4_4_ = iVar11;
    auVar132._0_4_ = iVar11;
    auVar132._8_4_ = iVar48;
    auVar132._12_4_ = iVar48;
    auVar166._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar166._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar166._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar166._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar29._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar29._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar29._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar29._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar29 = auVar29 & auVar166;
    auVar13 = packssdw(auVar132,auVar29);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      fc->motion_mode_cdf[lVar2 + 2][3] = 0;
    }
    auVar13 = pshufhw(auVar29,auVar29,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      fc->motion_mode_cdf[lVar2 + 3][3] = 0;
    }
    auVar13 = auVar91 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar133._4_4_ = iVar11;
    auVar133._0_4_ = iVar11;
    auVar133._8_4_ = iVar48;
    auVar133._12_4_ = iVar48;
    auVar167._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar167._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar167._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar167._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar30._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar30._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar30._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar30._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar30 = auVar30 & auVar167;
    auVar13 = pshuflw(auVar133,auVar30,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      fc->motion_mode_cdf[lVar2 + 4][3] = 0;
    }
    auVar13 = packssdw(auVar30,auVar30);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      fc->motion_mode_cdf[lVar2 + 5][3] = 0;
    }
    auVar13 = auVar71 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar134._4_4_ = iVar11;
    auVar134._0_4_ = iVar11;
    auVar134._8_4_ = iVar48;
    auVar134._12_4_ = iVar48;
    auVar168._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar168._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar168._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar168._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar31._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar31._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar31._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar31._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar31 = auVar31 & auVar168;
    auVar13 = packssdw(auVar134,auVar31);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      fc->motion_mode_cdf[lVar2 + 6][3] = 0;
    }
    auVar13 = pshufhw(auVar31,auVar31,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      fc->motion_mode_cdf[lVar2 + 7][3] = 0;
    }
    lVar2 = lVar2 + 8;
    lVar7 = auVar108._8_8_;
    auVar108._0_8_ = auVar108._0_8_ + 8;
    auVar108._8_8_ = lVar7 + 8;
    lVar7 = auVar100._8_8_;
    auVar100._0_8_ = auVar100._0_8_ + 8;
    auVar100._8_8_ = lVar7 + 8;
    lVar7 = auVar91._8_8_;
    auVar91._0_8_ = auVar91._0_8_ + 8;
    auVar91._8_8_ = lVar7 + 8;
    lVar7 = auVar71._8_8_;
    auVar71._0_8_ = auVar71._0_8_ + 8;
    auVar71._8_8_ = lVar7 + 8;
  } while (lVar2 != 0x18);
  lVar2 = 0;
  auVar72 = _DAT_004cbd20;
  auVar92 = _DAT_004cbd30;
  auVar101 = _DAT_004ca130;
  auVar109 = _DAT_004ca140;
  do {
    auVar13 = auVar109 ^ auVar1;
    auVar169._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar169._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar169._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar169._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar135._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar135._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar135._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar135._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar135 = auVar135 & auVar169;
    auVar13 = pshuflw(auVar13,auVar135,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->obmc_cdf[0] + lVar2 + 4) = 0;
    }
    auVar13 = packssdw(auVar135,auVar135);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)fc->obmc_cdf[1] + lVar2 + 4) = 0;
    }
    auVar13 = auVar101 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar136._4_4_ = iVar11;
    auVar136._0_4_ = iVar11;
    auVar136._8_4_ = iVar48;
    auVar136._12_4_ = iVar48;
    auVar170._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar170._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar170._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar170._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar32._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar32._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar32._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar32._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar32 = auVar32 & auVar170;
    auVar13 = packssdw(auVar136,auVar32);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->obmc_cdf[2] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar32,auVar32,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->obmc_cdf[3] + lVar2 + 4) = 0;
    }
    auVar13 = auVar92 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar137._4_4_ = iVar11;
    auVar137._0_4_ = iVar11;
    auVar137._8_4_ = iVar48;
    auVar137._12_4_ = iVar48;
    auVar171._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar171._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar171._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar171._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar33._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar33._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar33._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar33._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar33 = auVar33 & auVar171;
    auVar13 = pshuflw(auVar137,auVar33,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->obmc_cdf[4] + lVar2 + 4) = 0;
    }
    auVar13 = packssdw(auVar33,auVar33);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->obmc_cdf[5] + lVar2 + 4) = 0;
    }
    auVar13 = auVar72 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar138._4_4_ = iVar11;
    auVar138._0_4_ = iVar11;
    auVar138._8_4_ = iVar48;
    auVar138._12_4_ = iVar48;
    auVar172._0_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar172._4_4_ = -(uint)(iVar11 < -0x7fffffea);
    auVar172._8_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar172._12_4_ = -(uint)(iVar48 < -0x7fffffea);
    auVar34._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar34._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar34._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar34._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar34 = auVar34 & auVar172;
    auVar13 = packssdw(auVar138,auVar34);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->obmc_cdf[6] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar34,auVar34,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->obmc_cdf[7] + lVar2 + 4) = 0;
    }
    lVar7 = auVar109._8_8_;
    auVar109._0_8_ = auVar109._0_8_ + 8;
    auVar109._8_8_ = lVar7 + 8;
    lVar7 = auVar101._8_8_;
    auVar101._0_8_ = auVar101._0_8_ + 8;
    auVar101._8_8_ = lVar7 + 8;
    lVar7 = auVar92._8_8_;
    auVar92._0_8_ = auVar92._0_8_ + 8;
    auVar92._8_8_ = lVar7 + 8;
    lVar7 = auVar72._8_8_;
    auVar72._0_8_ = auVar72._0_8_ + 8;
    auVar72._8_8_ = lVar7 + 8;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x90);
  lVar2 = 0;
  fc->palette_y_size_cdf[0][7] = 0;
  fc->palette_y_size_cdf[1][7] = 0;
  fc->palette_y_size_cdf[2][7] = 0;
  fc->palette_y_size_cdf[3][7] = 0;
  fc->palette_y_size_cdf[4][7] = 0;
  fc->palette_y_size_cdf[5][7] = 0;
  fc->palette_y_size_cdf[6][7] = 0;
  fc->palette_uv_size_cdf[0][7] = 0;
  fc->palette_uv_size_cdf[1][7] = 0;
  fc->palette_uv_size_cdf[2][7] = 0;
  fc->palette_uv_size_cdf[3][7] = 0;
  fc->palette_uv_size_cdf[4][7] = 0;
  fc->palette_uv_size_cdf[5][7] = 0;
  fc->palette_uv_size_cdf[6][7] = 0;
  auVar13 = _DAT_004ca140;
  paVar4 = fc->palette_y_color_index_cdf[0][1] + 2;
  paVar5 = fc->palette_uv_color_index_cdf[0][1] + 2;
  do {
    lVar7 = 0;
    auVar93 = auVar13;
    do {
      if (SUB164(auVar93 ^ auVar1,4) == -0x80000000 && SUB164(auVar93 ^ auVar1,0) < -0x7ffffffb) {
        *(undefined2 *)((long)paVar4 + lVar7 + -0x12) = 0;
        *(undefined2 *)((long)paVar4 + lVar7) = 0;
      }
      lVar96 = auVar93._8_8_;
      auVar93._0_8_ = auVar93._0_8_ + 2;
      auVar93._8_8_ = lVar96 + 2;
      lVar7 = lVar7 + 0x24;
    } while (lVar7 != 0x6c);
    lVar7 = 0;
    auVar94 = auVar13;
    do {
      if (SUB164(auVar94 ^ auVar1,4) == -0x80000000 && SUB164(auVar94 ^ auVar1,0) < -0x7ffffffb) {
        *(undefined2 *)((long)paVar5 + lVar7 + -0x12) = 0;
        *(undefined2 *)((long)paVar5 + lVar7) = 0;
      }
      lVar96 = auVar94._8_8_;
      auVar94._0_8_ = auVar94._0_8_ + 2;
      auVar94._8_8_ = lVar96 + 2;
      lVar7 = lVar7 + 0x24;
    } while (lVar7 != 0x6c);
    lVar2 = lVar2 + 1;
    paVar4 = paVar4 + 0x2e;
    paVar5 = paVar5 + 0x2e;
  } while (lVar2 != 7);
  lVar2 = 0;
  auVar139 = _DAT_004cbd20;
  auVar173 = _DAT_004cbd30;
  auVar179 = _DAT_004ca130;
  auVar180 = _DAT_004ca140;
  do {
    auVar13 = auVar180 ^ auVar1;
    iVar11 = auVar13._0_4_;
    iVar48 = auVar13._8_4_;
    auVar9._4_4_ = iVar11;
    auVar9._0_4_ = iVar11;
    auVar9._8_4_ = iVar48;
    auVar9._12_4_ = iVar48;
    auVar73._0_4_ = -(uint)(iVar11 < -0x7fffffeb);
    auVar73._4_4_ = -(uint)(iVar11 < -0x7fffffeb);
    auVar73._8_4_ = -(uint)(iVar48 < -0x7fffffeb);
    auVar73._12_4_ = -(uint)(iVar48 < -0x7fffffeb);
    auVar35._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar35._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar35._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar35._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar35 = auVar35 & auVar73;
    auVar13 = pshuflw(auVar9,auVar35,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->palette_y_mode_cdf[0][0] + lVar2 + 4) = 0;
    }
    auVar13 = packssdw(auVar35,auVar35);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)fc->palette_y_mode_cdf[0][1] + lVar2 + 4) = 0;
    }
    auVar13 = auVar179 ^ auVar1;
    auVar74._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar74._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar74._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar74._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar36._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar36._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar36._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar36._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar13 = packssdw(auVar13,auVar36 & auVar74);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->palette_y_mode_cdf[0][2] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar13,auVar36 & auVar74,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->palette_y_mode_cdf[1][0] + lVar2 + 4) = 0;
    }
    auVar13 = auVar173 ^ auVar1;
    auVar75._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar75._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar75._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar75._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar37._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar37._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar37._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar37._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar37 = auVar37 & auVar75;
    auVar13 = pshuflw(auVar13,auVar37,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->palette_y_mode_cdf[1][1] + lVar2 + 4) = 0;
    }
    auVar38 = packssdw(auVar37,auVar37);
    auVar13 = packssdw(auVar13,auVar38);
    if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->palette_y_mode_cdf[1][2] + lVar2 + 4) = 0;
    }
    auVar13 = auVar139 ^ auVar1;
    auVar76._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar76._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar76._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar76._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar39._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar39._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar39._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar39._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar13 = packssdw(auVar13,auVar39 & auVar76);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->palette_y_mode_cdf[2][0] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar13,auVar39 & auVar76,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->palette_y_mode_cdf[2][1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar180._8_8_;
    auVar180._0_8_ = auVar180._0_8_ + 8;
    auVar180._8_8_ = lVar7 + 8;
    lVar7 = auVar179._8_8_;
    auVar179._0_8_ = auVar179._0_8_ + 8;
    auVar179._8_8_ = lVar7 + 8;
    lVar7 = auVar173._8_8_;
    auVar173._0_8_ = auVar173._0_8_ + 8;
    auVar173._8_8_ = lVar7 + 8;
    lVar7 = auVar139._8_8_;
    auVar139._0_8_ = auVar139._0_8_ + 8;
    auVar139._8_8_ = lVar7 + 8;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x90);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->palette_uv_mode_cdf[0] + lVar2 + 4) = 0;
    lVar2 = lVar2 + 6;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  auVar140 = _DAT_004ca140;
  do {
    if (SUB164(auVar140 ^ auVar1,4) == -0x80000000 && SUB164(auVar140 ^ auVar1,0) < -0x7ffffffb) {
      *(undefined2 *)((long)fc->comp_inter_cdf[0] + lVar2 + 4) = 0;
      *(undefined2 *)((long)fc->comp_inter_cdf[1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar140._8_8_;
    auVar140._0_8_ = auVar140._0_8_ + 2;
    auVar140._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x24);
  lVar2 = 0;
  auVar141 = _DAT_004ca140;
  do {
    if (SUB164(auVar141 ^ auVar1,4) == -0x80000000 && SUB164(auVar141 ^ auVar1,0) < -0x7fffffee) {
      *(undefined2 *)((long)fc->single_ref_cdf[0][0] + lVar2 + 4) = 0;
      *(undefined2 *)((long)fc->single_ref_cdf[0][1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar141._8_8_;
    auVar141._0_8_ = auVar141._0_8_ + 2;
    auVar141._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x6c);
  lVar2 = 0;
  auVar142 = _DAT_004ca140;
  do {
    if (SUB164(auVar142 ^ auVar1,4) == -0x80000000 && SUB164(auVar142 ^ auVar1,0) < -0x7ffffffb) {
      *(undefined2 *)((long)fc->comp_ref_type_cdf[0] + lVar2 + 4) = 0;
      *(undefined2 *)((long)fc->comp_ref_type_cdf[1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar142._8_8_;
    auVar142._0_8_ = auVar142._0_8_ + 2;
    auVar142._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x24);
  lVar2 = 0;
  auVar143 = _DAT_004ca140;
  do {
    if (SUB164(auVar143 ^ auVar1,4) == -0x80000000 && SUB164(auVar143 ^ auVar1,0) < -0x7ffffff7) {
      *(undefined2 *)((long)fc->uni_comp_ref_cdf[0][0] + lVar2 + 4) = 0;
      *(undefined2 *)((long)fc->uni_comp_ref_cdf[0][1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar143._8_8_;
    auVar143._0_8_ = auVar143._0_8_ + 2;
    auVar143._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x3c);
  lVar2 = 0;
  auVar144 = _DAT_004ca140;
  do {
    if (SUB164(auVar144 ^ auVar1,4) == -0x80000000 && SUB164(auVar144 ^ auVar1,0) < -0x7ffffff7) {
      *(undefined2 *)((long)fc->comp_ref_cdf[0][0] + lVar2 + 4) = 0;
      *(undefined2 *)((long)fc->comp_ref_cdf[0][1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar144._8_8_;
    auVar144._0_8_ = auVar144._0_8_ + 2;
    auVar144._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x3c);
  lVar2 = 0;
  auVar102 = _DAT_004ca140;
  do {
    if (SUB164(auVar102 ^ auVar1,4) == -0x80000000 && SUB164(auVar102 ^ auVar1,0) < -0x7ffffffa) {
      *(undefined2 *)((long)fc->comp_bwdref_cdf[0][0] + lVar2 + 4) = 0;
      *(undefined2 *)((long)fc->comp_bwdref_cdf[0][1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar102._8_8_;
    auVar102._0_8_ = auVar102._0_8_ + 2;
    auVar102._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x24);
  lVar2 = 0;
  auVar103 = _DAT_004cbd20;
  auVar110 = _DAT_004cbd30;
  auVar145 = _DAT_004ca130;
  auVar174 = _DAT_004ca140;
  do {
    auVar13 = auVar174 ^ auVar1;
    auVar77._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar77._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar77._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar77._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar40._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar40._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar40._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar40._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar40 = auVar40 & auVar77;
    auVar13 = pshuflw(auVar13,auVar40,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->txfm_partition_cdf[0] + lVar2 + 4) = 0;
    }
    auVar13 = packssdw(auVar40,auVar40);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)fc->txfm_partition_cdf[1] + lVar2 + 4) = 0;
    }
    auVar13 = auVar145 ^ auVar1;
    auVar78._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar78._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar78._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar78._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar41._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar41._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar41._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar41._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar13 = packssdw(auVar13,auVar41 & auVar78);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->txfm_partition_cdf[2] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar13,auVar41 & auVar78,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->txfm_partition_cdf[3] + lVar2 + 4) = 0;
    }
    auVar13 = auVar110 ^ auVar1;
    auVar79._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar79._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar79._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar79._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar42._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar42._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar42._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar42._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar42 = auVar42 & auVar79;
    auVar13 = pshuflw(auVar13,auVar42,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->txfm_partition_cdf[4] + lVar2 + 4) = 0;
    }
    auVar38 = packssdw(auVar42,auVar42);
    auVar13 = packssdw(auVar13,auVar38);
    if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->txfm_partition_cdf[5] + lVar2 + 4) = 0;
    }
    auVar13 = auVar103 ^ auVar1;
    auVar80._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar80._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffeb);
    auVar80._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar80._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffeb);
    auVar43._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar43._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar43._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar43._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar13 = packssdw(auVar13,auVar43 & auVar80);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->txfm_partition_cdf[6] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar13,auVar43 & auVar80,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->txfm_partition_cdf[7] + lVar2 + 4) = 0;
    }
    lVar7 = auVar174._8_8_;
    auVar174._0_8_ = auVar174._0_8_ + 8;
    auVar174._8_8_ = lVar7 + 8;
    lVar7 = auVar145._8_8_;
    auVar145._0_8_ = auVar145._0_8_ + 8;
    auVar145._8_8_ = lVar7 + 8;
    lVar7 = auVar110._8_8_;
    auVar110._0_8_ = auVar110._0_8_ + 8;
    auVar110._8_8_ = lVar7 + 8;
    lVar7 = auVar103._8_8_;
    auVar103._0_8_ = auVar103._0_8_ + 8;
    auVar103._8_8_ = lVar7 + 8;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x90);
  lVar2 = 0;
  auVar81 = _DAT_004ca140;
  do {
    if (SUB164(auVar81 ^ auVar1,4) == -0x80000000 && SUB164(auVar81 ^ auVar1,0) < -0x7ffffffa) {
      *(undefined2 *)((long)fc->compound_index_cdf[0] + lVar2 + 4) = 0;
      *(undefined2 *)((long)fc->compound_index_cdf[1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar81._8_8_;
    auVar81._0_8_ = auVar81._0_8_ + 2;
    auVar81._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x24);
  lVar2 = 0;
  auVar82 = _DAT_004ca140;
  do {
    if (SUB164(auVar82 ^ auVar1,4) == -0x80000000 && SUB164(auVar82 ^ auVar1,0) < -0x7ffffffa) {
      *(undefined2 *)((long)fc->comp_group_idx_cdf[0] + lVar2 + 4) = 0;
      *(undefined2 *)((long)fc->comp_group_idx_cdf[1] + lVar2 + 4) = 0;
    }
    lVar7 = auVar82._8_8_;
    auVar82._0_8_ = auVar82._0_8_ + 2;
    auVar82._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x24);
  lVar2 = 0;
  fc->skip_mode_cdfs[0][2] = 0;
  fc->skip_mode_cdfs[1][2] = 0;
  fc->skip_mode_cdfs[2][2] = 0;
  fc->skip_txfm_cdfs[0][2] = 0;
  fc->skip_txfm_cdfs[1][2] = 0;
  fc->skip_txfm_cdfs[2][2] = 0;
  do {
    *(undefined2 *)((long)fc->intra_inter_cdf[0] + lVar2 + 4) = 0;
    lVar2 = lVar2 + 6;
  } while (lVar2 != 0x18);
  (fc->nmvc).joints_cdf[4] = 0;
  auVar13 = _DAT_004ca140;
  paVar4 = (fc->nmvc).comps[0].class0_fp_cdf[0] + 4;
  paVar5 = (fc->nmvc).comps[0].bits_cdf[1] + 2;
  lVar2 = 0;
  do {
    (fc->nmvc).comps[lVar2].classes_cdf[0xb] = 0;
    lVar7 = 0;
    do {
      *(undefined2 *)((long)paVar4 + lVar7) = 0;
      lVar7 = lVar7 + 10;
    } while (lVar7 != 0x14);
    (fc->nmvc).comps[lVar2].fp_cdf[4] = 0;
    (fc->nmvc).comps[lVar2].sign_cdf[2] = 0;
    (fc->nmvc).comps[lVar2].class0_hp_cdf[2] = 0;
    (fc->nmvc).comps[lVar2].hp_cdf[2] = 0;
    (fc->nmvc).comps[lVar2].class0_cdf[2] = 0;
    lVar7 = 0;
    auVar111 = auVar13;
    do {
      if (SUB164(auVar111 ^ auVar1,4) == -0x80000000 && SUB164(auVar111 ^ auVar1,0) < -0x7ffffff6) {
        *(undefined2 *)((long)paVar5 + lVar7 + -6) = 0;
        *(undefined2 *)((long)paVar5 + lVar7) = 0;
      }
      lVar96 = auVar111._8_8_;
      auVar111._0_8_ = auVar111._0_8_ + 2;
      auVar111._8_8_ = lVar96 + 2;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x3c);
    paVar4 = paVar4 + 0x45;
    paVar5 = paVar5 + 0x45;
    bVar8 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar8);
  (fc->ndvc).joints_cdf[4] = 0;
  auVar13 = _DAT_004ca140;
  paVar4 = (fc->ndvc).comps[0].class0_fp_cdf[0] + 4;
  paVar5 = (fc->ndvc).comps[0].bits_cdf[1] + 2;
  lVar2 = 0;
  do {
    (fc->ndvc).comps[lVar2].classes_cdf[0xb] = 0;
    lVar7 = 0;
    do {
      *(undefined2 *)((long)paVar4 + lVar7) = 0;
      lVar7 = lVar7 + 10;
    } while (lVar7 != 0x14);
    (fc->ndvc).comps[lVar2].fp_cdf[4] = 0;
    (fc->ndvc).comps[lVar2].sign_cdf[2] = 0;
    (fc->ndvc).comps[lVar2].class0_hp_cdf[2] = 0;
    (fc->ndvc).comps[lVar2].hp_cdf[2] = 0;
    (fc->ndvc).comps[lVar2].class0_cdf[2] = 0;
    lVar7 = 0;
    auVar112 = auVar13;
    do {
      if (SUB164(auVar112 ^ auVar1,4) == -0x80000000 && SUB164(auVar112 ^ auVar1,0) < -0x7ffffff6) {
        *(undefined2 *)((long)paVar5 + lVar7 + -6) = 0;
        *(undefined2 *)((long)paVar5 + lVar7) = 0;
      }
      lVar96 = auVar112._8_8_;
      auVar112._0_8_ = auVar112._0_8_ + 2;
      auVar112._8_8_ = lVar96 + 2;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x3c);
    paVar4 = paVar4 + 0x45;
    paVar5 = paVar5 + 0x45;
    bVar8 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar8);
  lVar2 = 0;
  fc->intrabc_cdf[2] = 0;
  (fc->seg).pred_cdf[0][2] = 0;
  (fc->seg).pred_cdf[1][2] = 0;
  (fc->seg).pred_cdf[2][2] = 0;
  (fc->seg).spatial_pred_seg_cdf[0][8] = 0;
  (fc->seg).spatial_pred_seg_cdf[1][8] = 0;
  (fc->seg).spatial_pred_seg_cdf[2][8] = 0;
  auVar83 = _DAT_004cbd20;
  auVar95 = _DAT_004cbd30;
  auVar104 = _DAT_004ca130;
  auVar113 = _DAT_004ca140;
  do {
    auVar13 = auVar113 ^ auVar1;
    auVar50._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar50._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar50._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar50._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar44._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar44._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar44._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar44._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar44 = auVar44 & auVar50;
    auVar13 = pshuflw(auVar13,auVar44,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->filter_intra_cdfs[0] + lVar2 + 4) = 0;
    }
    auVar13 = packssdw(auVar44,auVar44);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)fc->filter_intra_cdfs[1] + lVar2 + 4) = 0;
    }
    auVar13 = auVar104 ^ auVar1;
    auVar51._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar51._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar51._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar51._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar45._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar45._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar45._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar45._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar13 = packssdw(auVar13,auVar45 & auVar51);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->filter_intra_cdfs[2] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar13,auVar45 & auVar51,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->filter_intra_cdfs[3] + lVar2 + 4) = 0;
    }
    auVar13 = auVar95 ^ auVar1;
    auVar52._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar52._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar52._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar52._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar46._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar46._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar46._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar46._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar46 = auVar46 & auVar52;
    auVar13 = pshuflw(auVar13,auVar46,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->filter_intra_cdfs[4] + lVar2 + 4) = 0;
    }
    auVar38 = packssdw(auVar46,auVar46);
    auVar13 = packssdw(auVar13,auVar38);
    if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->filter_intra_cdfs[5] + lVar2 + 4) = 0;
    }
    auVar13 = auVar83 ^ auVar1;
    auVar53._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar53._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffea);
    auVar53._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar53._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffea);
    auVar47._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar47._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar47._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar47._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar13 = packssdw(auVar13,auVar47 & auVar53);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->filter_intra_cdfs[6] + lVar2 + 4) = 0;
    }
    auVar13 = pshufhw(auVar13,auVar47 & auVar53,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)fc->filter_intra_cdfs[7] + lVar2 + 4) = 0;
    }
    lVar7 = auVar113._8_8_;
    auVar113._0_8_ = auVar113._0_8_ + 8;
    auVar113._8_8_ = lVar7 + 8;
    lVar7 = auVar104._8_8_;
    auVar104._0_8_ = auVar104._0_8_ + 8;
    auVar104._8_8_ = lVar7 + 8;
    lVar7 = auVar95._8_8_;
    auVar95._0_8_ = auVar95._0_8_ + 8;
    auVar95._8_8_ = lVar7 + 8;
    lVar7 = auVar83._8_8_;
    auVar83._0_8_ = auVar83._0_8_ + 8;
    auVar83._8_8_ = lVar7 + 8;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x90);
  lVar2 = 0;
  fc->filter_intra_mode_cdf[5] = 0;
  fc->switchable_restore_cdf[3] = 0;
  fc->wiener_restore_cdf[2] = 0;
  fc->sgrproj_restore_cdf[2] = 0;
  do {
    *(undefined2 *)((long)fc->y_mode_cdf[0] + lVar2 + 0x1a) = 0;
    lVar2 = lVar2 + 0x1c;
  } while (lVar2 != 0x70);
  lVar2 = 0;
  auVar62 = _DAT_004ca140;
  do {
    if (SUB164(auVar62 ^ auVar1,4) == -0x80000000 && SUB164(auVar62 ^ auVar1,0) < -0x7ffffff3) {
      *(undefined2 *)((long)fc->uv_mode_cdf[0][0] + lVar2 + 0x1a) = 0;
      *(undefined2 *)((long)fc->uv_mode_cdf[0][1] + lVar2 + 0x1a) = 0;
    }
    lVar7 = auVar62._8_8_;
    auVar62._0_8_ = auVar62._0_8_ + 2;
    auVar62._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0x3c;
  } while (lVar2 != 0x1a4);
  lVar2 = 0;
  auVar63 = _DAT_004ca140;
  do {
    if (SUB164(auVar63 ^ auVar1,4) == -0x80000000 && SUB164(auVar63 ^ auVar1,0) < -0x7ffffff3) {
      *(undefined2 *)((long)fc->uv_mode_cdf[1][0] + lVar2 + 0x1c) = 0;
      *(undefined2 *)((long)fc->uv_mode_cdf[1][1] + lVar2 + 0x1c) = 0;
    }
    lVar7 = auVar63._8_8_;
    auVar63._0_8_ = auVar63._0_8_ + 2;
    auVar63._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0x3c;
  } while (lVar2 != 0x1a4);
  uVar3 = 0;
  pFVar6 = fc;
  do {
    lVar2 = (ulong)(uVar3 < 0x10) * 4 + 0x3542;
    if (uVar3 < 4) {
      lVar2 = 0x353a;
    }
    *(undefined2 *)((long)pFVar6->txb_skip_cdf[0][0] + lVar2) = 0;
    uVar3 = uVar3 + 1;
    pFVar6 = (FRAME_CONTEXT *)(pFVar6->txb_skip_cdf[0][3] + 2);
  } while (uVar3 != 0x14);
  lVar2 = 0;
  do {
    fc->switchable_interp_cdf[lVar2][3] = 0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  lVar2 = 0;
  auVar55 = _DAT_004ca140;
  do {
    if (SUB164(auVar55 ^ auVar1,4) == -0x80000000 && SUB164(auVar55 ^ auVar1,0) < -0x7fffffe7) {
      *(undefined2 *)((long)fc->kf_y_cdf[0][0] + lVar2 + 0x1a) = 0;
      *(undefined2 *)((long)fc->kf_y_cdf[0][1] + lVar2 + 0x1a) = 0;
    }
    lVar7 = auVar55._8_8_;
    auVar55._0_8_ = auVar55._0_8_ + 2;
    auVar55._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0x2d8);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->angle_delta_cdf[0] + lVar2 + 0xe) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x80);
  lVar2 = 0;
  fc->tx_size_cdf[0][0][2] = 0;
  fc->tx_size_cdf[0][1][2] = 0;
  fc->tx_size_cdf[0][2][2] = 0;
  fc->tx_size_cdf[1][0][3] = 0;
  fc->tx_size_cdf[1][1][3] = 0;
  fc->tx_size_cdf[1][2][3] = 0;
  fc->tx_size_cdf[2][0][3] = 0;
  fc->tx_size_cdf[2][1][3] = 0;
  fc->tx_size_cdf[2][2][3] = 0;
  fc->tx_size_cdf[3][0][3] = 0;
  fc->tx_size_cdf[3][1][3] = 0;
  fc->tx_size_cdf[3][2][3] = 0;
  fc->delta_q_cdf[4] = 0;
  fc->delta_lf_cdf[4] = 0;
  do {
    *(undefined2 *)((long)fc->delta_lf_multi_cdf[0] + lVar2 + 8) = 0;
    lVar2 = lVar2 + 10;
  } while (lVar2 != 0x28);
  lVar2 = 0;
  auVar64 = _DAT_004ca130;
  auVar84 = _DAT_004ca140;
  do {
    if (SUB164(auVar84 ^ auVar1,4) == -0x80000000 && SUB164(auVar84 ^ auVar1,0) < -0x7fffffcc) {
      *(undefined2 *)((long)fc->intra_ext_tx_cdf[1][0][0] + lVar2 + 0xe) = 0;
      *(undefined2 *)((long)fc->intra_ext_tx_cdf[1][0][1] + lVar2 + 0xe) = 0;
    }
    if (SUB164(auVar64 ^ auVar1,4) == -0x80000000 && SUB164(auVar64 ^ auVar1,0) < -0x7fffffcc) {
      *(undefined2 *)((long)fc->intra_ext_tx_cdf[1][0][2] + lVar2 + 0xe) = 0;
      *(undefined2 *)((long)fc->intra_ext_tx_cdf[1][0][3] + lVar2 + 0xe) = 0;
    }
    lVar7 = auVar84._8_8_;
    auVar84._0_8_ = auVar84._0_8_ + 4;
    auVar84._8_8_ = lVar7 + 4;
    lVar7 = auVar64._8_8_;
    auVar64._0_8_ = auVar64._0_8_ + 4;
    auVar64._8_8_ = lVar7 + 4;
    lVar2 = lVar2 + 0x88;
  } while (lVar2 != 0x6e8);
  lVar2 = 0;
  auVar65 = _DAT_004ca130;
  auVar85 = _DAT_004ca140;
  do {
    if (SUB164(auVar85 ^ auVar1,4) == -0x80000000 && SUB164(auVar85 ^ auVar1,0) < -0x7fffffcc) {
      *(undefined2 *)((long)fc->intra_ext_tx_cdf[2][0][0] + lVar2 + 10) = 0;
      *(undefined2 *)((long)fc->intra_ext_tx_cdf[2][0][1] + lVar2 + 10) = 0;
    }
    if (SUB164(auVar65 ^ auVar1,4) == -0x80000000 && SUB164(auVar65 ^ auVar1,0) < -0x7fffffcc) {
      *(undefined2 *)((long)fc->intra_ext_tx_cdf[2][0][2] + lVar2 + 10) = 0;
      *(undefined2 *)((long)fc->intra_ext_tx_cdf[2][0][3] + lVar2 + 10) = 0;
    }
    lVar7 = auVar85._8_8_;
    auVar85._0_8_ = auVar85._0_8_ + 4;
    auVar85._8_8_ = lVar7 + 4;
    lVar7 = auVar65._8_8_;
    auVar65._0_8_ = auVar65._0_8_ + 4;
    auVar65._8_8_ = lVar7 + 4;
    lVar2 = lVar2 + 0x88;
  } while (lVar2 != 0x6e8);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->inter_ext_tx_cdf[1][0] + lVar2 + 0x20) = 0;
    lVar2 = lVar2 + 0x22;
  } while (lVar2 != 0x88);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->inter_ext_tx_cdf[2][0] + lVar2 + 0x18) = 0;
    lVar2 = lVar2 + 0x22;
  } while (lVar2 != 0x88);
  lVar2 = 0;
  do {
    *(undefined2 *)((long)fc->inter_ext_tx_cdf[3][0] + lVar2 + 4) = 0;
    lVar2 = lVar2 + 0x22;
  } while (lVar2 != 0x88);
  fc->cfl_sign_cdf[8] = 0;
  lVar2 = 0;
  auVar10 = _DAT_004ca140;
  do {
    if (SUB164(auVar10 ^ auVar1,4) == -0x80000000 && SUB164(auVar10 ^ auVar1,0) < -0x7ffffffa) {
      *(undefined2 *)((long)fc->cfl_alpha_cdf[0] + lVar2 + 0x20) = 0;
      *(undefined2 *)((long)fc->cfl_alpha_cdf[1] + lVar2 + 0x20) = 0;
    }
    lVar7 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 2;
    auVar10._8_8_ = lVar7 + 2;
    lVar2 = lVar2 + 0x44;
  } while (lVar2 != 0xcc);
  return;
}

Assistant:

void av1_reset_cdf_symbol_counters(FRAME_CONTEXT *fc) {
  RESET_CDF_COUNTER(fc->txb_skip_cdf, 2);
  RESET_CDF_COUNTER(fc->eob_extra_cdf, 2);
  RESET_CDF_COUNTER(fc->dc_sign_cdf, 2);
  RESET_CDF_COUNTER(fc->eob_flag_cdf16, 5);
  RESET_CDF_COUNTER(fc->eob_flag_cdf32, 6);
  RESET_CDF_COUNTER(fc->eob_flag_cdf64, 7);
  RESET_CDF_COUNTER(fc->eob_flag_cdf128, 8);
  RESET_CDF_COUNTER(fc->eob_flag_cdf256, 9);
  RESET_CDF_COUNTER(fc->eob_flag_cdf512, 10);
  RESET_CDF_COUNTER(fc->eob_flag_cdf1024, 11);
  RESET_CDF_COUNTER(fc->coeff_base_eob_cdf, 3);
  RESET_CDF_COUNTER(fc->coeff_base_cdf, 4);
  RESET_CDF_COUNTER(fc->coeff_br_cdf, BR_CDF_SIZE);
  RESET_CDF_COUNTER(fc->newmv_cdf, 2);
  RESET_CDF_COUNTER(fc->zeromv_cdf, 2);
  RESET_CDF_COUNTER(fc->refmv_cdf, 2);
  RESET_CDF_COUNTER(fc->drl_cdf, 2);
  RESET_CDF_COUNTER(fc->inter_compound_mode_cdf, INTER_COMPOUND_MODES);
  RESET_CDF_COUNTER(fc->compound_type_cdf, MASKED_COMPOUND_TYPES);
  RESET_CDF_COUNTER(fc->wedge_idx_cdf, 16);
  RESET_CDF_COUNTER(fc->interintra_cdf, 2);
  RESET_CDF_COUNTER(fc->wedge_interintra_cdf, 2);
  RESET_CDF_COUNTER(fc->interintra_mode_cdf, INTERINTRA_MODES);
  RESET_CDF_COUNTER(fc->motion_mode_cdf, MOTION_MODES);
  RESET_CDF_COUNTER(fc->obmc_cdf, 2);
  RESET_CDF_COUNTER(fc->palette_y_size_cdf, PALETTE_SIZES);
  RESET_CDF_COUNTER(fc->palette_uv_size_cdf, PALETTE_SIZES);
  for (int j = 0; j < PALETTE_SIZES; j++) {
    int nsymbs = j + PALETTE_MIN_SIZE;
    RESET_CDF_COUNTER_STRIDE(fc->palette_y_color_index_cdf[j], nsymbs,
                             CDF_SIZE(PALETTE_COLORS));
    RESET_CDF_COUNTER_STRIDE(fc->palette_uv_color_index_cdf[j], nsymbs,
                             CDF_SIZE(PALETTE_COLORS));
  }
  RESET_CDF_COUNTER(fc->palette_y_mode_cdf, 2);
  RESET_CDF_COUNTER(fc->palette_uv_mode_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_inter_cdf, 2);
  RESET_CDF_COUNTER(fc->single_ref_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_ref_type_cdf, 2);
  RESET_CDF_COUNTER(fc->uni_comp_ref_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_ref_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_bwdref_cdf, 2);
  RESET_CDF_COUNTER(fc->txfm_partition_cdf, 2);
  RESET_CDF_COUNTER(fc->compound_index_cdf, 2);
  RESET_CDF_COUNTER(fc->comp_group_idx_cdf, 2);
  RESET_CDF_COUNTER(fc->skip_mode_cdfs, 2);
  RESET_CDF_COUNTER(fc->skip_txfm_cdfs, 2);
  RESET_CDF_COUNTER(fc->intra_inter_cdf, 2);
  reset_nmv_counter(&fc->nmvc);
  reset_nmv_counter(&fc->ndvc);
  RESET_CDF_COUNTER(fc->intrabc_cdf, 2);
  RESET_CDF_COUNTER(fc->seg.pred_cdf, 2);
  RESET_CDF_COUNTER(fc->seg.spatial_pred_seg_cdf, MAX_SEGMENTS);
  RESET_CDF_COUNTER(fc->filter_intra_cdfs, 2);
  RESET_CDF_COUNTER(fc->filter_intra_mode_cdf, FILTER_INTRA_MODES);
  RESET_CDF_COUNTER(fc->switchable_restore_cdf, RESTORE_SWITCHABLE_TYPES);
  RESET_CDF_COUNTER(fc->wiener_restore_cdf, 2);
  RESET_CDF_COUNTER(fc->sgrproj_restore_cdf, 2);
  RESET_CDF_COUNTER(fc->y_mode_cdf, INTRA_MODES);
  RESET_CDF_COUNTER_STRIDE(fc->uv_mode_cdf[0], UV_INTRA_MODES - 1,
                           CDF_SIZE(UV_INTRA_MODES));
  RESET_CDF_COUNTER(fc->uv_mode_cdf[1], UV_INTRA_MODES);
  for (int i = 0; i < PARTITION_CONTEXTS; i++) {
    if (i < 4) {
      RESET_CDF_COUNTER_STRIDE(fc->partition_cdf[i], 4, CDF_SIZE(10));
    } else if (i < 16) {
      RESET_CDF_COUNTER(fc->partition_cdf[i], 10);
    } else {
      RESET_CDF_COUNTER_STRIDE(fc->partition_cdf[i], 8, CDF_SIZE(10));
    }
  }
  RESET_CDF_COUNTER(fc->switchable_interp_cdf, SWITCHABLE_FILTERS);
  RESET_CDF_COUNTER(fc->kf_y_cdf, INTRA_MODES);
  RESET_CDF_COUNTER(fc->angle_delta_cdf, 2 * MAX_ANGLE_DELTA + 1);
  RESET_CDF_COUNTER_STRIDE(fc->tx_size_cdf[0], MAX_TX_DEPTH,
                           CDF_SIZE(MAX_TX_DEPTH + 1));
  RESET_CDF_COUNTER(fc->tx_size_cdf[1], MAX_TX_DEPTH + 1);
  RESET_CDF_COUNTER(fc->tx_size_cdf[2], MAX_TX_DEPTH + 1);
  RESET_CDF_COUNTER(fc->tx_size_cdf[3], MAX_TX_DEPTH + 1);
  RESET_CDF_COUNTER(fc->delta_q_cdf, DELTA_Q_PROBS + 1);
  RESET_CDF_COUNTER(fc->delta_lf_cdf, DELTA_LF_PROBS + 1);
  for (int i = 0; i < FRAME_LF_COUNT; i++) {
    RESET_CDF_COUNTER(fc->delta_lf_multi_cdf[i], DELTA_LF_PROBS + 1);
  }
  RESET_CDF_COUNTER_STRIDE(fc->intra_ext_tx_cdf[1], 7, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->intra_ext_tx_cdf[2], 5, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->inter_ext_tx_cdf[1], 16, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->inter_ext_tx_cdf[2], 12, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER_STRIDE(fc->inter_ext_tx_cdf[3], 2, CDF_SIZE(TX_TYPES));
  RESET_CDF_COUNTER(fc->cfl_sign_cdf, CFL_JOINT_SIGNS);
  RESET_CDF_COUNTER(fc->cfl_alpha_cdf, CFL_ALPHABET_SIZE);
}